

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

int tcu::anon_unknown_74::channelToInt(deUint8 *value,ChannelType type)

{
  int iVar1;
  float fVar2;
  
  iVar1 = 0;
  switch(type) {
  case SNORM_INT8:
  case SIGNED_INT8:
    return (int)(char)*value;
  case SNORM_INT16:
  case SIGNED_INT16:
    return (int)*(short *)value;
  case SNORM_INT32:
  case UNORM_INT32:
  case SIGNED_INT32:
  case UNSIGNED_INT32:
    return *(int *)value;
  case UNORM_INT8:
  case UNSIGNED_INT8:
    return (int)*value;
  case UNORM_INT16:
  case UNSIGNED_INT16:
    return (int)*(ushort *)value;
  case UNORM_INT24:
  case UNSIGNED_INT24:
    return (uint)*(uint3 *)value;
  case HALF_FLOAT:
    fVar2 = deFloat16To32(*(deFloat16 *)value);
    return (int)fVar2;
  case FLOAT:
    return (int)*(float *)value;
  case FLOAT64:
    iVar1 = (int)*(double *)value;
  }
  return iVar1;
}

Assistant:

inline int channelToInt (const deUint8* value, TextureFormat::ChannelType type)
{
	// make sure this table is updated if format table is updated
	DE_STATIC_ASSERT(TextureFormat::CHANNELTYPE_LAST == 38);

	switch (type)
	{
		case TextureFormat::SNORM_INT8:			return (int)*((const deInt8*)value);
		case TextureFormat::SNORM_INT16:		return (int)*((const deInt16*)value);
		case TextureFormat::SNORM_INT32:		return (int)*((const deInt32*)value);
		case TextureFormat::UNORM_INT8:			return (int)*((const deUint8*)value);
		case TextureFormat::UNORM_INT16:		return (int)*((const deUint16*)value);
		case TextureFormat::UNORM_INT24:		return (int)readUint24(value);
		case TextureFormat::UNORM_INT32:		return (int)*((const deUint32*)value);
		case TextureFormat::SIGNED_INT8:		return (int)*((const deInt8*)value);
		case TextureFormat::SIGNED_INT16:		return (int)*((const deInt16*)value);
		case TextureFormat::SIGNED_INT32:		return (int)*((const deInt32*)value);
		case TextureFormat::UNSIGNED_INT8:		return (int)*((const deUint8*)value);
		case TextureFormat::UNSIGNED_INT16:		return (int)*((const deUint16*)value);
		case TextureFormat::UNSIGNED_INT24:		return (int)readUint24(value);
		case TextureFormat::UNSIGNED_INT32:		return (int)*((const deUint32*)value);
		case TextureFormat::HALF_FLOAT:			return (int)deFloat16To32(*(const deFloat16*)value);
		case TextureFormat::FLOAT:				return (int)*((const float*)value);
		case TextureFormat::FLOAT64:			return (int)*((const double*)value);
		default:
			DE_ASSERT(DE_FALSE);
			return 0;
	}
}